

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LogicalAndLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_logicaland(NeuralNetworkLayer *this)

{
  bool bVar1;
  LogicalAndLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_logicaland(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_logicaland(this);
    this_00 = (LogicalAndLayerParams *)operator_new(0x18);
    LogicalAndLayerParams::LogicalAndLayerParams(this_00);
    (this->layer_).logicaland_ = this_00;
  }
  return (LogicalAndLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalAndLayerParams* NeuralNetworkLayer::mutable_logicaland() {
  if (!has_logicaland()) {
    clear_layer();
    set_has_logicaland();
    layer_.logicaland_ = new ::CoreML::Specification::LogicalAndLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.logicalAnd)
  return layer_.logicaland_;
}